

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileFor(jx9_gen_state *pGen)

{
  uint uVar1;
  uint uVar2;
  SyToken *pSVar3;
  SyToken *pSVar4;
  void *pvVar5;
  SySet *pSVar6;
  SyToken *pSVar7;
  sxi32 sVar8;
  sxi32 sVar9;
  ulong uVar10;
  char *zFormat;
  sxu32 nLine;
  GenBlock **ppBlock;
  ulong uVar11;
  SyToken *pSVar12;
  GenBlock *pForBlock;
  SyToken *pEnd;
  sxu32 nFalseJump;
  SyToken *local_48;
  SyToken *pSStack_40;
  
  pEnd = (SyToken *)0x0;
  pForBlock = (GenBlock *)0x0;
  pSVar3 = pGen->pIn;
  nLine = pSVar3->nLine;
  pGen->pIn = pSVar3 + 1;
  if ((pSVar3 + 1 < pGen->pEnd) && ((pSVar3[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar3 + 2;
    jx9DelimitNestedTokens(pSVar3 + 2,pGen->pEnd,0x200,0x400,&pEnd);
    pSVar3 = pEnd;
    if ((pGen->pIn == pEnd) || (pSVar12 = pGen->pEnd, pSVar12 <= pEnd)) {
      sVar9 = jx9GenCompileError(pGen,1,nLine,"for: Invalid expression");
      if (sVar9 == -10) {
        return -10;
      }
      pGen->pIn = pSVar3;
      if (pGen->pEnd <= pSVar3) {
        return 0;
      }
      pGen->pIn = pSVar3 + 1;
      return 0;
    }
    pGen->pEnd = pEnd;
    sVar9 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar9 == -10) {
      return -10;
    }
    if (sVar9 != -3) {
      jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
    }
    pSVar4 = pGen->pIn;
    if ((pSVar4->nType & 0x40000) == 0) {
      nLine = pSVar4->nLine;
      zFormat = "for: Expected \';\' after initialization expressions";
    }
    else {
      pGen->pIn = pSVar4 + 1;
      sVar9 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&pForBlock);
      if (sVar9 != 0) {
        return -10;
      }
      pForBlock->bPostContinue = '\x01';
      sVar9 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar9 == -10) {
        return -10;
      }
      if (sVar9 != -3) {
        jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&nFalseJump);
        GenStateNewJumpFixup(pForBlock,9,nFalseJump);
      }
      pSVar4 = pGen->pIn;
      if ((pSVar4->nType & 0x40000) == 0) {
        nLine = pSVar4->nLine;
        zFormat = "for: Expected \';\' after conditionals expressions";
      }
      else {
        pGen->pIn = pSVar3 + 1;
        pGen->pEnd = pSVar12;
        sVar9 = jx9CompileBlock(pGen);
        if (sVar9 == -10) {
          return -10;
        }
        uVar10 = (ulong)(pForBlock->aPostContFix).nUsed;
        if (uVar10 != 0) {
          pvVar5 = (pForBlock->aPostContFix).pBase;
          pSVar6 = pGen->pVm->pByteContainer;
          uVar1 = pSVar6->nUsed;
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            uVar2 = *(uint *)((long)pvVar5 + uVar11 * 8 + 4);
            if ((uVar2 < uVar1) && (pSVar6->pBase != (void *)0x0)) {
              *(uint *)((long)pSVar6->pBase + (ulong)(uVar2 * pSVar6->eSize) + 8) = uVar1;
            }
          }
        }
        do {
          pSVar12 = pSVar4 + 1;
          if (pSVar3 <= pSVar12) goto LAB_0012344b;
          pSVar7 = pSVar4 + 1;
          pSVar4 = pSVar12;
        } while ((pSVar7->nType & 0x40000) != 0);
        local_48 = pGen->pIn;
        pSStack_40 = pGen->pEnd;
        pGen->pIn = pSVar12;
        pGen->pEnd = pSVar3;
        sVar9 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if (pGen->pEnd <= pGen->pIn) {
          pGen->pIn = local_48;
          pGen->pEnd = pSStack_40;
          if (sVar9 == -10) {
            return -10;
          }
          if (sVar9 != -3) {
            jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
          }
LAB_0012344b:
          jx9VmEmitInstr(pGen->pVm,8,0,pForBlock->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
          ppBlock = (GenBlock **)0xffffffffffffffff;
          GenStateFixJumps(pForBlock,-1,pGen->pVm->pByteContainer->nUsed);
          GenStateLeaveBlock(pGen,ppBlock);
          return 0;
        }
        nLine = pGen->pIn->nLine;
        zFormat = "for: Expected \')\' after post-expressions";
      }
    }
  }
  else {
    zFormat = "Expected \'(\' after \'for\' keyword";
  }
  sVar9 = 0;
  sVar8 = jx9GenCompileError(pGen,1,nLine,zFormat);
  if (sVar8 == -10) {
    sVar9 = -10;
  }
  return sVar9;
}

Assistant:

static sxi32 jx9CompileFor(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pPostStart, *pEnd = 0;
	GenBlock *pForBlock = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'for' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'for' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Delimit the init-expr;condition;post-expr */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "for: Invalid expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile initialization expressions if available */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Pop operand lvalues */
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after initialization expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Deffer continue jumps */
	pForBlock->bPostContinue = TRUE;
	/* Compile the condition */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pForBlock, JX9_OP_JZ, nFalseJump);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after conditionals expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Save the post condition stream */
	pPostStart = pGen->pIn;
	/* Compile the loop body */
	pGen->pIn  = &pEnd[1]; /* Jump the trailing parenthesis ')' */
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Fix post-continue jumps */
	if( SySetUsed(&pForBlock->aPostContFix) > 0 ){
		JumpFixup *aPost;
		VmInstr *pInstr;
		sxu32 nJumpDest;
		sxu32 n;
		aPost = (JumpFixup *)SySetBasePtr(&pForBlock->aPostContFix);
		nJumpDest = jx9VmInstrLength(pGen->pVm);
		for( n = 0 ; n < SySetUsed(&pForBlock->aPostContFix) ; ++n ){
			pInstr = jx9VmGetInstr(pGen->pVm, aPost[n].nInstrIdx);
			if( pInstr ){
				/* Fix jump */
				pInstr->iP2 = nJumpDest;
			}
		}
	}
	/* compile the post-expressions if available */
	while( pPostStart < pEnd && (pPostStart->nType & JX9_TK_SEMI) ){
		pPostStart++;
	}
	if( pPostStart < pEnd ){
		SyToken *pTmpIn, *pTmpEnd;
		SWAP_DELIMITER(pGen, pPostStart, pEnd);
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( pGen->pIn < pGen->pEnd ){
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "for: Expected ')' after post-expressions");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}
		RE_SWAP_DELIMITER(pGen);
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY){
			/* Pop operand lvalue */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
}